

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void __thiscall arm::ConstValue::display(ConstValue *this,ostream *o)

{
  value_type vVar1;
  int iVar2;
  bool bVar3;
  add_pointer_t<const_unsigned_int> ptVar4;
  ostream *poVar5;
  add_pointer_t<const_std::vector<unsigned_int>_> this_00;
  const_reference pvVar6;
  size_type sVar7;
  void *pvVar8;
  int *piVar9;
  add_pointer_t<const_std::__cxx11::basic_string<char>_> ptVar10;
  ostream *in_RSI;
  long in_RDI;
  add_pointer_t<const_std::__cxx11::basic_string<char>_> x_2;
  uint32_t new_item;
  int i;
  bool newline;
  int repeat_count;
  uint32_t last;
  add_pointer_t<const_std::vector<unsigned_int>_> x_1;
  add_pointer_t<const_unsigned_int> x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa0;
  int local_30;
  int local_28;
  uint local_24;
  
  ptVar4 = std::
           get_if<unsigned_int,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::__cxx11::string>
                     ((variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x2c5a11);
  if (ptVar4 == (add_pointer_t<const_unsigned_int>)0x0) {
    this_00 = std::
              get_if<std::vector<unsigned_int,std::allocator<unsigned_int>>,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::__cxx11::string>
                        ((variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x2c5a51);
    if (this_00 == (add_pointer_t<const_std::vector<unsigned_int>_>)0x0) {
      ptVar10 = std::
                get_if<std::__cxx11::string,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::__cxx11::string>
                          ((variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x2c5d23);
      if (ptVar10 != (add_pointer_t<const_std::__cxx11::basic_string<char>_>)0x0) {
        if (*(int *)(in_RDI + 0x2c) == 1) {
          poVar5 = std::operator<<(in_RSI,"\t.asciz \"");
          poVar5 = std::operator<<(poVar5,(string *)ptVar10);
          std::operator<<(poVar5,"\"");
        }
        else if (*(int *)(in_RDI + 0x2c) == 0) {
          poVar5 = std::operator<<(in_RSI,"\t.word ");
          std::operator<<(poVar5,(string *)ptVar10);
        }
      }
    }
    else {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                         (in_stack_ffffffffffffffa0);
      local_28 = 1;
      bVar3 = true;
      local_24 = *pvVar6;
      for (local_30 = 1;
          sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00),
          (ulong)(long)local_30 < sVar7; local_30 = local_30 + 1) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (this_00,(long)local_30);
        vVar1 = *pvVar6;
        if (bVar3) {
          if (vVar1 == local_24) {
            local_28 = local_28 + 1;
          }
          else {
            poVar5 = (ostream *)
                     std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(poVar5,"\t.word ");
            std::ostream::operator<<(poVar5,local_24);
          }
          bVar3 = false;
        }
        else if (vVar1 == local_24) {
          local_28 = local_28 + 1;
        }
        else if (local_28 < 2) {
          poVar5 = std::operator<<(in_RSI,", ");
          std::ostream::operator<<(poVar5,local_24);
        }
        else {
          poVar5 = (ostream *)
                   std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"\t.fill ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_28);
          poVar5 = std::operator<<(poVar5,", 4, ");
          std::ostream::operator<<(poVar5,local_24);
          bVar3 = true;
          local_28 = 1;
        }
        local_24 = vVar1;
      }
      if (local_28 < 2) {
        poVar5 = std::operator<<(in_RSI,", ");
        pvVar8 = (void *)std::ostream::operator<<(poVar5,local_24);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(in_RSI,"\t.fill ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_28);
        poVar5 = std::operator<<(poVar5,", 4, ");
        pvVar8 = (void *)std::ostream::operator<<(poVar5,local_24);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      bVar3 = std::optional::operator_cast_to_bool((optional<int> *)0x2c5c6a);
      if (bVar3) {
        sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
        piVar9 = std::optional<int>::value((optional<int> *)in_stack_ffffffffffffffa0);
        if (sVar7 < (ulong)(long)*piVar9) {
          poVar5 = std::operator<<(in_RSI,"\t.fill ");
          piVar9 = std::optional<int>::value((optional<int> *)poVar5);
          iVar2 = *piVar9;
          sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(long)iVar2 - sVar7);
          poVar5 = std::operator<<(poVar5,", 4, ");
          pvVar8 = (void *)std::ostream::operator<<(poVar5,local_24);
          std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        }
      }
    }
  }
  else {
    poVar5 = std::operator<<(in_RSI,"\t.word ");
    std::ostream::operator<<(poVar5,*ptVar4);
  }
  return;
}

Assistant:

void ConstValue::display(std::ostream &o) const {
  if (auto x = std::get_if<uint32_t>(this)) {
    o << "\t.word " << *x;
  } else if (auto x = std::get_if<std::vector<uint32_t>>(this)) {
    uint32_t last = x->front();
    int repeat_count = 1;
    bool newline = true;
    for (int i = 1; i < x->size(); i++) {
      uint32_t new_item = (*x)[i];
      if (newline) {
        if (new_item == last) {
          repeat_count++;
        } else {
          o << std::endl << "\t.word " << last;
        }
        newline = false;
      } else {
        if (new_item == last) {
          repeat_count++;
        } else {
          if (repeat_count > 1) {
            o << std::endl << "\t.fill " << repeat_count << ", 4, " << last;
            newline = true;
            repeat_count = 1;
          } else {
            o << ", " << last;
          }
        }
      }
      last = new_item;
    }
    if (repeat_count > 1) {
      o << std::endl;
      o << "\t.fill " << repeat_count << ", 4, " << last << std::endl;
      newline = true;
      repeat_count = 1;
    } else {
      o << ", " << last << std::endl;
    }
    if (len && x->size() < len.value()) {
      o << "\t.fill " << (len.value() - x->size()) << ", 4, " << last
        << std::endl;
    }
  } else if (auto x = std::get_if<std::string>(this)) {
    if (ty == ConstType::AsciZ)
      o << "\t.asciz \"" << *x << "\"";
    else if (ty == ConstType::Word)
      o << "\t.word " << *x;
  }
}